

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall GameBoard::GameBoard(GameBoard *this)

{
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)0x0;
  memset(this->gridInfo,0,0xa10);
  init(this,ctx);
  return;
}

Assistant:

GameBoard::GameBoard()
{
    init();
}